

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stable-imu-fixed-contact-dynamical-system.cpp
# Opt level: O1

Quaternion * __thiscall
stateObservation::flexibilityEstimation::StableIMUFixedContactDynamicalSystem::computeQuaternion_
          (Quaternion *__return_storage_ptr__,StableIMUFixedContactDynamicalSystem *this,Vector3 *x)

{
  double *pdVar1;
  double dVar2;
  undefined1 auVar3 [16];
  double dVar4;
  undefined1 auVar5 [16];
  double dVar6;
  ActualDstType actualDst;
  SrcEvaluatorType srcEvaluator;
  double local_40;
  undefined1 local_38 [32];
  
  dVar2 = (this->orientationVector_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_2,_3,_1>_>.
          m_storage.m_data.array[0];
  if ((((dVar2 == (x->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
                  .array[0]) &&
       (!NAN(dVar2) &&
        !NAN((x->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
             array[0]))) &&
      (dVar2 = (this->orientationVector_).
               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_2,_3,_1>_>.m_storage.m_data.array
               [1],
      pdVar1 = (x->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
               array + 1, dVar2 == *pdVar1)) && (!NAN(dVar2) && !NAN(*pdVar1))) {
    dVar2 = (this->orientationVector_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_2,_3,_1>_>.
            m_storage.m_data.array[2];
    pdVar1 = (x->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
             array + 2;
    if ((dVar2 == *pdVar1) && (!NAN(dVar2) && !NAN(*pdVar1))) goto LAB_001549e3;
  }
  dVar2 = (x->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
          [1];
  (this->orientationVector_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_2,_3,_1>_>.m_storage.
  m_data.array[0] =
       (x->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[0];
  (this->orientationVector_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_2,_3,_1>_>.m_storage.
  m_data.array[1] = dVar2;
  (this->orientationVector_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_2,_3,_1>_>.m_storage.
  m_data.array[2] =
       (x->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[2];
  dVar4 = (x->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
          [0];
  dVar6 = (x->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
          [1];
  dVar2 = (x->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
          [2];
  dVar2 = dVar2 * dVar2 + dVar6 * dVar6 + dVar4 * dVar4;
  if (dVar2 <= 9.999999999999999e-33) {
    local_38._0_16_ = ZEXT816(0);
    local_40 = 1.0;
    dVar2 = 0.0;
  }
  else {
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    auVar5._8_8_ = dVar2;
    auVar5._0_8_ = dVar2;
    local_38._0_16_ =
         divpd(*(undefined1 (*) [16])
                (x->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
                array,auVar5);
    local_40 = (x->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
               array[2] / dVar2;
    dVar2 = dVar2 * 0.5;
  }
  dVar4 = cos(dVar2);
  (this->quaternion_).m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_2,_4,_1>_>.
  m_storage.m_data.array[3] = dVar4;
  dVar2 = sin(dVar2);
  auVar3._8_4_ = SUB84(dVar2 * (double)local_38._8_8_,0);
  auVar3._0_8_ = dVar2 * (double)local_38._0_8_;
  auVar3._12_4_ = (int)((ulong)(dVar2 * (double)local_38._8_8_) >> 0x20);
  *(undefined1 (*) [16])
   (this->quaternion_).m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_2,_4,_1>_>.
   m_storage.m_data.array = auVar3;
  (this->quaternion_).m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_2,_4,_1>_>.
  m_storage.m_data.array[2] = local_40 * dVar2;
LAB_001549e3:
  dVar2 = (this->quaternion_).m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_2,_4,_1>_>.
          m_storage.m_data.array[1];
  (__return_storage_ptr__->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
  m_storage.m_data.array[0] =
       (this->quaternion_).m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_2,_4,_1>_>.
       m_storage.m_data.array[0];
  (__return_storage_ptr__->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
  m_storage.m_data.array[1] = dVar2;
  dVar2 = (this->quaternion_).m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_2,_4,_1>_>.
          m_storage.m_data.array[3];
  (__return_storage_ptr__->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
  m_storage.m_data.array[2] =
       (this->quaternion_).m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_2,_4,_1>_>.
       m_storage.m_data.array[2];
  (__return_storage_ptr__->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
  m_storage.m_data.array[3] = dVar2;
  return __return_storage_ptr__;
}

Assistant:

Quaternion StableIMUFixedContactDynamicalSystem::computeQuaternion_(const Vector3 & x)
{
  if(orientationVector_ != x)
  {
    orientationVector_ = x;
    quaternion_ = kine::rotationVectorToAngleAxis(x);
  }

  return quaternion_;
}